

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMMParser.cpp
# Opt level: O1

bool __thiscall
cmm::CMMParser::parseBinOpRHS
          (CMMParser *this,int8_t ExprPrec,
          unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *Res)

{
  TokenKind TokenKind;
  ExpressionAST *pEVar1;
  pointer pcVar2;
  __uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> _Var3;
  _Head_base<0UL,_cmm::ExpressionAST_*,_false> _Var4;
  undefined1 auVar5 [8];
  _Head_base<0UL,_cmm::ExpressionAST_*,_false> _Var6;
  undefined8 uVar7;
  bool bVar8;
  int8_t iVar9;
  int8_t iVar10;
  Token TVar11;
  ExpressionAST *pEVar12;
  undefined7 in_register_00000031;
  ulong uVar13;
  unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> RHS;
  string Symbol;
  bool local_9c;
  _Head_base<0UL,_cmm::ExpressionAST_*,_false> local_98;
  _Head_base<0UL,_cmm::ExpressionAST_*,_false> local_90;
  __uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> local_88;
  uint local_7c;
  undefined1 local_78 [8];
  _Head_base<0UL,_cmm::ExpressionAST_*,_false> local_70;
  _Head_base<0UL,_cmm::ExpressionAST_*,_false> local_68;
  _Head_base<0UL,_cmm::ExpressionAST_*,_false> local_60;
  undefined1 local_58 [32];
  AST local_38;
  
  local_98._M_head_impl = (ExpressionAST *)0x0;
  local_60._M_head_impl = (ExpressionAST *)Res;
  if ((this->Lexer).CurTok.Kind == Equal) {
    TVar11 = CMMLexer::LexToken(&this->Lexer);
    (this->Lexer).CurTok.Kind = TVar11.Kind;
    bVar8 = parseExpression(this,(unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>
                                  *)&local_98);
    _Var4._M_head_impl = local_60._M_head_impl;
    local_9c = true;
    if (!bVar8) {
      local_68._M_head_impl =
           (((__uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)
            &((local_60._M_head_impl)->super_AST)._vptr_AST)->_M_t).
           super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
           super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
      (((__uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)
       &((local_60._M_head_impl)->super_AST)._vptr_AST)->_M_t).
      super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
      super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl = (ExpressionAST *)0x0;
      local_70._M_head_impl = local_98._M_head_impl;
      local_98._M_head_impl = (ExpressionAST *)0x0;
      BinaryOperatorAST::create
                ((BinaryOperatorAST *)local_58,Equal,
                 (unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)
                 &local_68,
                 (unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)
                 &local_70);
      uVar7 = local_58._0_8_;
      local_58._0_8_ = (_func_int **)0x0;
      pEVar1 = (((__uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)
                &((_Var4._M_head_impl)->super_AST)._vptr_AST)->_M_t).
               super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>
               .super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
      (((__uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)
       &((_Var4._M_head_impl)->super_AST)._vptr_AST)->_M_t).
      super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
      super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl = (ExpressionAST *)uVar7;
      if (pEVar1 != (ExpressionAST *)0x0) {
        (*(pEVar1->super_AST)._vptr_AST[1])();
      }
      if ((_func_int **)local_58._0_8_ != (_func_int **)0x0) {
        (**(code **)(*(_func_int **)local_58._0_8_ + 8))();
      }
      local_58._0_8_ = (ExpressionAST *)0x0;
      if (local_70._M_head_impl != (ExpressionAST *)0x0) {
        (*((local_70._M_head_impl)->super_AST)._vptr_AST[1])();
      }
      local_70._M_head_impl = (ExpressionAST *)0x0;
      if (local_68._M_head_impl != (ExpressionAST *)0x0) {
        (*((local_68._M_head_impl)->super_AST)._vptr_AST[1])();
      }
      local_68._M_head_impl = (ExpressionAST *)0x0;
      local_9c = false;
    }
  }
  else {
    local_7c = (uint)CONCAT71(in_register_00000031,ExprPrec);
    uVar13 = CONCAT71(in_register_00000031,ExprPrec) & 0xffffffff;
    local_38._vptr_AST = (_func_int **)&PTR__InfixOpExprAST_001239f0;
    local_9c = false;
    do {
      TokenKind = (this->Lexer).CurTok.Kind;
      iVar9 = getBinOpPrecedence(this);
      if (iVar9 < (char)uVar13) {
        bVar8 = false;
        local_9c = false;
      }
      else {
        local_58._0_8_ = local_58 + 0x10;
        pcVar2 = (this->Lexer).StrVal._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_58,pcVar2,pcVar2 + (this->Lexer).StrVal._M_string_length);
        TVar11 = CMMLexer::LexToken(&this->Lexer);
        (this->Lexer).CurTok.Kind = TVar11.Kind;
        bVar8 = parsePrimaryExpression
                          (this,(unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>
                                 *)&local_98);
        if (bVar8) {
LAB_00109959:
          bVar8 = false;
          local_9c = true;
        }
        else {
          iVar10 = getBinOpPrecedence(this);
          if (iVar9 < iVar10) {
            bVar8 = parseBinOpRHS(this,iVar9 + '\x01',
                                  (unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>
                                   *)&local_98);
            if (bVar8) goto LAB_00109959;
          }
          _Var4._M_head_impl = local_60._M_head_impl;
          if (TokenKind == InfixOp) {
            pEVar12 = (ExpressionAST *)operator_new(0x40);
            _Var6._M_head_impl = local_60._M_head_impl;
            _Var4._M_head_impl = local_98._M_head_impl;
            pEVar1 = (((__uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>
                        *)&((local_60._M_head_impl)->super_AST)._vptr_AST)->_M_t).
                     super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>
                     .super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
            (((__uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)
             &((local_60._M_head_impl)->super_AST)._vptr_AST)->_M_t).
            super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
            super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl = (ExpressionAST *)0x0;
            local_98._M_head_impl = (ExpressionAST *)0x0;
            pEVar12->Kind = InfixOpExpression;
            (pEVar12->super_AST)._vptr_AST = local_38._vptr_AST;
            pEVar12[1].super_AST._vptr_AST = (_func_int **)(pEVar12 + 2);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(pEVar12 + 1),local_58._0_8_,local_58._8_8_ + local_58._0_8_);
            pEVar12[3].super_AST._vptr_AST = (_func_int **)pEVar1;
            *(ExpressionAST **)&pEVar12[3].Kind = _Var4._M_head_impl;
            pEVar1 = (((__uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>
                        *)&((_Var6._M_head_impl)->super_AST)._vptr_AST)->_M_t).
                     super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>
                     .super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
            (((__uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)
             &((_Var6._M_head_impl)->super_AST)._vptr_AST)->_M_t).
            super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
            super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl = pEVar12;
            bVar8 = true;
            if (pEVar1 != (ExpressionAST *)0x0) {
              (*(pEVar1->super_AST)._vptr_AST[1])();
            }
            uVar13 = (ulong)local_7c;
          }
          else {
            local_88._M_t.
            super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
            super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl =
                 *(tuple<cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_> *)
                  local_60._M_head_impl;
            *(__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
              *)local_60._M_head_impl =
                 (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                  )0x0;
            local_90._M_head_impl = local_98._M_head_impl;
            local_98._M_head_impl = (ExpressionAST *)0x0;
            BinaryOperatorAST::tryFoldBinOp
                      ((BinaryOperatorAST *)local_78,TokenKind,
                       (unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)
                       &local_88,
                       (unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)
                       &local_90);
            auVar5 = local_78;
            local_78 = (undefined1  [8])0x0;
            _Var3._M_t.
            super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
            super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl =
                 *(tuple<cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_> *)
                  _Var4._M_head_impl;
            *(undefined1 (*) [8])_Var4._M_head_impl = auVar5;
            if ((__uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>)
                _Var3._M_t.
                super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>
                .super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl !=
                (__uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>)0x0)
            {
              (**(code **)(*(long *)_Var3._M_t.
                                    super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>
                                    .super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl
                          + 8))();
            }
            if (local_78 != (undefined1  [8])0x0) {
              (**(code **)(*(_func_int **)local_78 + 8))();
            }
            local_78 = (undefined1  [8])0x0;
            if (local_90._M_head_impl != (ExpressionAST *)0x0) {
              (*((local_90._M_head_impl)->super_AST)._vptr_AST[1])();
            }
            local_90._M_head_impl = (ExpressionAST *)0x0;
            if (local_88._M_t.
                super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>
                .super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl !=
                (_Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>)
                0x0) {
              (**(code **)(*(long *)local_88._M_t.
                                    super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>
                                    .super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl
                          + 8))();
            }
            local_88._M_t.
            super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
            super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl =
                 (tuple<cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>)
                 (_Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>)
                 0x0;
            bVar8 = true;
          }
        }
        if ((ExpressionAST *)local_58._0_8_ != (ExpressionAST *)(local_58 + 0x10)) {
          operator_delete((void *)local_58._0_8_);
        }
      }
    } while (bVar8);
  }
  if (local_98._M_head_impl != (ExpressionAST *)0x0) {
    (*((local_98._M_head_impl)->super_AST)._vptr_AST[1])();
  }
  return local_9c;
}

Assistant:

bool CMMParser::parseBinOpRHS(int8_t ExprPrec,
                              std::unique_ptr<ExpressionAST> &Res) {
  std::unique_ptr<ExpressionAST> RHS;

  // Handle assignment expression first.
  if (Lexer.getTok().is(Token::Equal)) {
    Lex();
    if (parseExpression(RHS))
      return true;
    Res = BinaryOperatorAST::create(Token::Equal,
                                    std::move(Res), std::move(RHS));
    return false;
  }
  for (;;) {
    Token::TokenKind TokenKind = getKind();

    // If this is a binOp, find its precedence.
    int8_t TokPrec = getBinOpPrecedence();
    // If the next token is lower precedence than we are allowed to eat,
    // return successfully with what we ate already.
    if (TokPrec < ExprPrec)
      return false;

    // Save the potential symbol before lex.
    std::string Symbol = Lexer.getStrVal();
    // Eat the binary operator.
    Lex();
    // Eat the next primary expression.
    if (parsePrimaryExpression(RHS))
      return true;

    // If BinOp binds less tightly with RHS than the operator after RHS, let
    // the pending operator take RHS as its LHS.
    int8_t NextPrec = getBinOpPrecedence();
    if (TokPrec < NextPrec && parseBinOpRHS(++TokPrec, RHS))
      return true;

    // Merge LHS and RHS according to operator.
    if (TokenKind == Token::InfixOp)
      Res.reset(new InfixOpExprAST(Symbol, std::move(Res), std::move(RHS)));
    else
      Res = BinaryOperatorAST::tryFoldBinOp(TokenKind, std::move(Res),
                                             std::move(RHS));
  }
}